

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl.h
# Opt level: O0

void __thiscall
flatbuffers::SymbolTable<flatbuffers::EnumVal>::~SymbolTable
          (SymbolTable<flatbuffers::EnumVal> *this)

{
  EnumVal *this_00;
  bool bVar1;
  reference ppEVar2;
  __normal_iterator<flatbuffers::EnumVal_**,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
  local_20;
  __normal_iterator<flatbuffers::EnumVal_**,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
  local_18;
  iterator it;
  SymbolTable<flatbuffers::EnumVal> *this_local;
  
  it._M_current = (EnumVal **)this;
  local_18._M_current =
       (EnumVal **)
       std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>::begin
                 (&this->vec);
  while( true ) {
    local_20._M_current =
         (EnumVal **)
         std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>::end
                   (&this->vec);
    bVar1 = __gnu_cxx::operator!=(&local_18,&local_20);
    if (!bVar1) break;
    ppEVar2 = __gnu_cxx::
              __normal_iterator<flatbuffers::EnumVal_**,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
              ::operator*(&local_18);
    this_00 = *ppEVar2;
    if (this_00 != (EnumVal *)0x0) {
      EnumVal::~EnumVal(this_00);
      operator_delete(this_00,0xa8);
    }
    __gnu_cxx::
    __normal_iterator<flatbuffers::EnumVal_**,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
    ::operator++(&local_18);
  }
  std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>::~vector(&this->vec);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::EnumVal_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::EnumVal_*>_>_>
  ::~map(&this->dict);
  return;
}

Assistant:

~SymbolTable() {
    for (auto it = vec.begin(); it != vec.end(); ++it) { delete *it; }
  }